

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

Buffer __thiscall nvim::Nvim::get_current_buf(Nvim *this)

{
  allocator local_39;
  string local_38;
  Buffer local_18;
  Buffer res;
  Nvim *this_local;
  
  res = (Buffer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"nvim_get_current_buf",&local_39);
  NvimRPC::call<>(&this->client_,&local_38,&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return local_18;
}

Assistant:

Buffer Nvim::get_current_buf() {
    Buffer res;
    client_.call("nvim_get_current_buf", res);
    return res;
}